

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O1

void testing::internal::PrintCharAndCodeTo<signed_char>(char c,ostream *os)

{
  undefined4 uVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  bool bVar4;
  uint32_t value;
  long lVar5;
  char *pcVar6;
  undefined7 in_register_00000039;
  int iVar7;
  string local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"",0);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
  iVar7 = (int)CONCAT71(in_register_00000039,c);
  switch(CONCAT71(in_register_00000039,c) & 0xffffffff) {
  case 0:
    pcVar6 = "\\0";
    break;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
switchD_0015d7f4_caseD_1:
    if (0x5e < (byte)c - 0x20) {
      uVar1 = *(undefined4 *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]);
      std::__ostream_insert<char,std::char_traits<char>>(os,"\\x",2);
      pp_Var2 = os->_vptr_basic_ostream;
      p_Var3 = pp_Var2[-3];
      *(uint *)(&os->field_0x18 + (long)p_Var3) =
           *(uint *)(&os->field_0x18 + (long)p_Var3) & 0xffffffb5 | 8;
      *(uint *)(&os->field_0x18 + (long)pp_Var2[-3]) =
           *(uint *)(&os->field_0x18 + (long)pp_Var2[-3]) | 0x4000;
      std::ostream::operator<<(os,(uint)(byte)c);
      *(undefined4 *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]) = uVar1;
      bVar4 = true;
      goto LAB_0015d889;
    }
    pcVar6 = (char *)&local_48;
    lVar5 = 1;
    local_48._M_dataplus._M_p._0_1_ = c;
    goto LAB_0015d87e;
  case 7:
    pcVar6 = "\\a";
    break;
  case 8:
    pcVar6 = "\\b";
    break;
  case 9:
    pcVar6 = "\\t";
    break;
  case 10:
    pcVar6 = "\\n";
    break;
  case 0xb:
    pcVar6 = "\\v";
    break;
  case 0xc:
    pcVar6 = "\\f";
    break;
  case 0xd:
    pcVar6 = "\\r";
    break;
  default:
    if (iVar7 == 0x27) {
      pcVar6 = "\\\'";
    }
    else {
      if (iVar7 != 0x5c) goto switchD_0015d7f4_caseD_1;
      pcVar6 = "\\\\";
    }
  }
  lVar5 = 2;
LAB_0015d87e:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,lVar5);
  bVar4 = false;
LAB_0015d889:
  std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
  if (c != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    std::ostream::operator<<(os,(int)c);
    if (9 < (byte)c && !bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", 0x",4);
      String::FormatHexUInt32_abi_cxx11_(&local_48,(String *)(ulong)(uint)(int)c,value);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p
                                    ),local_48._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
          &local_48.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p),
                        local_48.field_2._M_allocated_capacity + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  }
  return;
}

Assistant:

void PrintCharAndCodeTo(Char c, ostream* os) {
  // First, print c as a literal in the most readable form we can find.
  *os << GetCharWidthPrefix(c) << "'";
  const CharFormat format = PrintAsCharLiteralTo(c, os);
  *os << "'";

  // To aid user debugging, we also print c's code in decimal, unless
  // it's 0 (in which case c was printed as '\\0', making the code
  // obvious).
  if (c == 0)
    return;
  *os << " (" << static_cast<int>(c);

  // For more convenience, we print c's code again in hexadecimal,
  // unless c was already printed in the form '\x##' or the code is in
  // [1, 9].
  if (format == kHexEscape || (1 <= c && c <= 9)) {
    // Do nothing.
  } else {
    *os << ", 0x" << String::FormatHexInt(static_cast<int>(c));
  }
  *os << ")";
}